

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_thread_impl.cc
# Opt level: O3

bool __thiscall dd::ProcessThreadImpl::Process(ProcessThreadImpl *this)

{
  Lock *__mutex;
  iterator *piVar1;
  bool bVar2;
  pointer pDVar3;
  QueuedTask *pQVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  _Elt_pointer ppQVar9;
  _List_node_base *p_Var10;
  _List_node_base *p_Var11;
  _List_node_base *p_Var12;
  
  lVar6 = std::chrono::_V2::system_clock::now();
  __mutex = &this->_lock;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  bVar2 = this->_stop;
  if (bVar2 == true) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  else {
    lVar6 = lVar6 / 1000000;
    p_Var11 = (_List_node_base *)(lVar6 + 60000);
    for (p_Var12 = (this->_modules).
                   super__List_base<dd::ProcessThreadImpl::ModuleCallback,_std::allocator<dd::ProcessThreadImpl::ModuleCallback>_>
                   ._M_impl._M_node.super__List_node_base._M_next;
        p_Var12 != (_List_node_base *)&this->_modules; p_Var12 = p_Var12->_M_next) {
      p_Var10 = p_Var12[1]._M_prev;
      if (p_Var10 == (_List_node_base *)0x0) {
        lVar7 = (**(code **)(p_Var12[1]._M_next)->_M_next)();
        if (lVar7 < 1) {
          lVar7 = 0;
        }
        p_Var10 = (_List_node_base *)(lVar7 + lVar6);
        p_Var12[1]._M_prev = p_Var10;
      }
      if ((long)p_Var10 <= lVar6 || p_Var10 == (_List_node_base *)0xffffffffffffffff) {
        (**(code **)((long)(p_Var12[1]._M_next)->_M_next + 8))();
        lVar7 = std::chrono::_V2::system_clock::now();
        lVar8 = (**(code **)(p_Var12[1]._M_next)->_M_next)();
        if (lVar8 < 1) {
          lVar8 = 0;
        }
        p_Var10 = (_List_node_base *)(lVar8 + lVar7 / 1000000);
        p_Var12[1]._M_prev = p_Var10;
      }
      if ((long)p_Var10 < (long)p_Var11) {
        p_Var11 = p_Var10;
      }
    }
    while (pDVar3 = (this->_delayed_tasks).c.
                    super__Vector_base<dd::ProcessThreadImpl::DelayedTask,_std::allocator<dd::ProcessThreadImpl::DelayedTask>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          pDVar3 != (this->_delayed_tasks).c.
                    super__Vector_base<dd::ProcessThreadImpl::DelayedTask,_std::allocator<dd::ProcessThreadImpl::DelayedTask>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
      p_Var12 = (_List_node_base *)pDVar3->run_at_ms;
      if (lVar6 < (long)p_Var12) {
        if ((long)p_Var12 < (long)p_Var11) {
          p_Var11 = p_Var12;
        }
        break;
      }
      ppQVar9 = (this->_queue).c.
                super__Deque_base<dd::QueuedTask_*,_std::allocator<dd::QueuedTask_*>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur;
      if (ppQVar9 ==
          (this->_queue).c.super__Deque_base<dd::QueuedTask_*,_std::allocator<dd::QueuedTask_*>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<dd::QueuedTask*,std::allocator<dd::QueuedTask*>>::
        _M_push_back_aux<dd::QueuedTask*const&>
                  ((deque<dd::QueuedTask*,std::allocator<dd::QueuedTask*>> *)&this->_queue,
                   &pDVar3->task);
      }
      else {
        *ppQVar9 = pDVar3->task;
        piVar1 = &(this->_queue).c.
                  super__Deque_base<dd::QueuedTask_*,_std::allocator<dd::QueuedTask_*>_>._M_impl.
                  super__Deque_impl_data._M_finish;
        piVar1->_M_cur = piVar1->_M_cur + 1;
      }
      std::
      priority_queue<dd::ProcessThreadImpl::DelayedTask,_std::vector<dd::ProcessThreadImpl::DelayedTask,_std::allocator<dd::ProcessThreadImpl::DelayedTask>_>,_std::less<dd::ProcessThreadImpl::DelayedTask>_>
      ::pop(&this->_delayed_tasks);
    }
    ppQVar9 = (this->_queue).c.
              super__Deque_base<dd::QueuedTask_*,_std::allocator<dd::QueuedTask_*>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur;
    if ((this->_queue).c.super__Deque_base<dd::QueuedTask_*,_std::allocator<dd::QueuedTask_*>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_cur != ppQVar9) {
      do {
        pQVar4 = *ppQVar9;
        std::deque<dd::QueuedTask_*,_std::allocator<dd::QueuedTask_*>_>::pop_front
                  (&(this->_queue).c);
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        iVar5 = (*pQVar4->_vptr_QueuedTask[2])(pQVar4);
        if ((char)iVar5 != '\0') {
          (*pQVar4->_vptr_QueuedTask[1])(pQVar4);
        }
        pthread_mutex_lock((pthread_mutex_t *)__mutex);
        ppQVar9 = (this->_queue).c.
                  super__Deque_base<dd::QueuedTask_*,_std::allocator<dd::QueuedTask_*>_>._M_impl.
                  super__Deque_impl_data._M_start._M_cur;
      } while ((this->_queue).c.
               super__Deque_base<dd::QueuedTask_*,_std::allocator<dd::QueuedTask_*>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur != ppQVar9);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    lVar6 = std::chrono::_V2::system_clock::now();
    lVar6 = SUB168(SEXT816(lVar6) * SEXT816(-0x431bde82d7b634db),8);
    lVar6 = ((lVar6 >> 0x12) - (lVar6 >> 0x3f)) + (long)p_Var11;
    if (0 < lVar6) {
      iVar5 = (int)lVar6;
      Event::Wait(&this->_wake_up,iVar5,-(uint)(iVar5 != -1) | 3000);
    }
  }
  return (bool)(bVar2 ^ 1);
}

Assistant:

bool ProcessThreadImpl::Process() {
		int64_t now = GetCurrentTick();
		int64_t next_checkpoint = now + (1000 * 60);

		{
			AutoLock l(_lock);
			if (_stop)
				return false;
			for (ModuleCallback& m : _modules) {
				if (m.next_callback == 0)
					m.next_callback = GetNextCallbackTime(m.module, now);
				if (m.next_callback <= now || m.next_callback == kCallProcessImmediately) {
					{
						m.module->Process();
					}
					int64_t new_now = GetCurrentTick();
					m.next_callback = GetNextCallbackTime(m.module, new_now);
				}

				if (m.next_callback < next_checkpoint)
					next_checkpoint = m.next_callback;
			}

			while (!_delayed_tasks.empty() && _delayed_tasks.top().run_at_ms <= now) {
				_queue.push(_delayed_tasks.top().task);
				_delayed_tasks.pop();
			}

			if (!_delayed_tasks.empty())
			{
				if (_delayed_tasks.top().run_at_ms < next_checkpoint)
					next_checkpoint = _delayed_tasks.top().run_at_ms;
			}

			while (!_queue.empty()) {
				QueuedTask* task = _queue.front();
				_queue.pop();
				_lock.LockEnd();
				if (task->Run())
					delete task;
				_lock.LockBegin();
			}
		}
		
		int64_t time_to_wait = next_checkpoint - GetCurrentTick();
		if (time_to_wait > 0)
			_wake_up.Wait(static_cast<int>(time_to_wait));
		return true;
	}